

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O3

bool __thiscall NaPNDelay::activate(NaPNDelay *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this->nActiveSleep == 0) {
    uVar4 = NaPetriNode::activations(&this->super_NaPetriNode);
    bVar2 = uVar4 < this->nMaxLag;
    this->bAwaken = !bVar2;
    if (bVar2) goto LAB_0013de27;
  }
  else {
    this->bAwaken = true;
  }
  iVar3 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
  if ((char)iVar3 != '\0') {
    pcVar5 = NaPetriNode::name(&this->super_NaPetriNode);
    uVar4 = NaPetriNode::activations(&this->super_NaPetriNode);
    NaPrintLog("node \'%s\' is awaken: activations=%d, delay=",pcVar5,(ulong)uVar4);
    uVar6 = (ulong)(uint)this->nOutDim;
    if (this->nOutDim != 0) {
      uVar7 = 0;
      do {
        uVar1 = uVar7 + 1;
        pcVar5 = "%d,";
        if (uVar1 == uVar6) {
          pcVar5 = "%d\n";
        }
        NaPrintLog(pcVar5,(ulong)this->piOutMap[uVar7]);
        uVar6 = (ulong)(uint)this->nOutDim;
        uVar7 = uVar1;
      } while (uVar1 < uVar6);
    }
  }
LAB_0013de27:
  bVar2 = NaPetriCnInput::is_waiting(&this->in);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (this->bAwaken == true) {
      bVar2 = NaPetriCnOutput::is_waiting(&this->dout);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool
NaPNDelay::activate ()
{
  // For action() and post_action() only
  bAwaken = awake();

  if(bAwaken && is_verbose())
    {
      unsigned	i;
      NaPrintLog("node '%s' is awaken: activations=%d, delay=",
		 name(), activations());
      for(i = 0; i < nOutDim; ++i)
	if(i + 1 == nOutDim)
	  NaPrintLog("%d\n", piOutMap[i]);
	else
	  NaPrintLog("%d,", piOutMap[i]);
    }

  // Does not depend on bAwaken state and output state, so 
  return !in.is_waiting() &&
    (!bAwaken || (bAwaken && !dout.is_waiting()));
}